

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memsave.cpp
# Opt level: O0

int save_raw(char *file_name,char *buf,unsigned_long len)

{
  FILE *__s;
  size_t sVar1;
  FILE *fp;
  int ret;
  unsigned_long len_local;
  char *buf_local;
  char *file_name_local;
  
  __s = fopen(file_name,"wb");
  if (__s == (FILE *)0x0) {
    printf("Failed to open: %s\n",file_name);
    file_name_local._4_4_ = -1;
  }
  else {
    sVar1 = fwrite(buf,1,len,__s);
    if ((int)sVar1 < 0) {
      printf("Failed to write file\n");
      fclose(__s);
      file_name_local._4_4_ = -1;
    }
    else {
      fclose(__s);
      file_name_local._4_4_ = 0;
    }
  }
  return file_name_local._4_4_;
}

Assistant:

int save_raw(char *file_name, char *buf, unsigned long len)
{
	int ret;
	FILE *fp = fopen(file_name, "wb");
	if (fp == NULL) {
		printf("Failed to open: %s\n", file_name);
		return -1;
	}
	
	ret = fwrite(buf, 1, len, fp);
	if (ret < 0) {
		printf("Failed to write file\n");
		fclose(fp);
		return -1;
	}
	
	fclose(fp);
	return 0;	
}